

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,optional<wasm::Name> label,HeapType type)

{
  bool bVar1;
  Signature sig;
  Name label_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_b0;
  Err local_88;
  string local_68;
  HeapType local_48;
  HeapType type_local;
  allocator<char> local_31;
  
  local_48.id = type.id;
  bVar1 = HeapType::isSignature(&local_48);
  if (bVar1) {
    type_local.id = (uintptr_t)&this->irBuilder;
    if (label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_engaged == false) {
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
           (char *)0x0;
    }
    sig = HeapType::getSignature(&local_48);
    label_00.super_IString.str._M_str =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
    label_00.super_IString.str._M_len =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    IRBuilder::makeBlock((Result<wasm::Ok> *)&local_b0,(IRBuilder *)type_local.id,label_00,sig);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_b0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected function type",&local_31);
    Lexer::err(&local_88,&this->in,(ulong)pos,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBlock(Index pos,
                     const std::vector<Annotation>& annotations,
                     std::optional<Name> label,
                     HeapType type) {
    // TODO: validate labels?
    // TODO: Move error on input types to here?
    if (!type.isSignature()) {
      return in.err(pos, "expected function type");
    }
    return withLoc(
      pos, irBuilder.makeBlock(label ? *label : Name{}, type.getSignature()));
  }